

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FixedLinearAllocator.hpp
# Opt level: O1

Char * __thiscall
Diligent::FixedLinearAllocator::CopyString(FixedLinearAllocator *this,char *Str,size_t StrLen)

{
  Char *__dest;
  
  if (Str == (char *)0x0) {
    __dest = (Char *)0x0;
  }
  else {
    if (StrLen == 0) {
      StrLen = strlen(Str);
    }
    __dest = (Char *)Allocate(this,StrLen + 1,1);
    memcpy(__dest,Str,StrLen);
    __dest[StrLen] = '\0';
  }
  return __dest;
}

Assistant:

NODISCARD const Char* CopyString(const char* Str, size_t StrLen = 0)
    {
        if (Str == nullptr)
            return nullptr;

        if (StrLen == 0)
            StrLen = strlen(Str);

        auto* Ptr = reinterpret_cast<Char*>(Allocate(StrLen + 1, 1));
        std::memcpy(Ptr, Str, StrLen);
        Ptr[StrLen] = '\0';

        return Ptr;
    }